

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall CLIntercept::chromeRegisterCommandQueue(CLIntercept *this,cl_command_queue queue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type mVar2;
  pointer pcVar3;
  cl_command_queue p_Var4;
  _Alloc_hider _Var5;
  int iVar6;
  cl_int cVar7;
  cl_int cVar8;
  cl_int cVar9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  undefined8 uVar12;
  pthread_mutex_t *__mutex;
  pointer unaff_R12;
  cl_uint queueIndex;
  cl_device_id device;
  string trackName;
  cl_command_queue_properties properties;
  string deviceIndexString;
  cl_uint queueFamily;
  cl_device_type deviceType;
  cl_command_queue local_c8;
  uint local_bc;
  key_type local_b8;
  pthread_mutex_t *local_b0;
  mapped_type local_a4;
  string local_a0;
  ulong local_80;
  string local_78;
  string local_58;
  undefined8 local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_Mutex;
  local_c8 = queue;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 == 0) {
    local_b8 = (cl_device_id)0x0;
    local_38 = 0;
    local_80 = 0;
    cVar7 = (*(this->m_Dispatch).clGetCommandQueueInfo)(queue,0x1091,8,&local_b8,(size_t *)0x0);
    cVar8 = (*(this->m_Dispatch).clGetDeviceInfo)(local_b8,0x1000,8,&local_38,(size_t *)0x0);
    cVar9 = (*(this->m_Dispatch).clGetCommandQueueInfo)(local_c8,0x1093,8,&local_80,(size_t *)0x0);
    if ((cVar8 == 0 && cVar7 == 0) && cVar9 == 0) {
      local_b0 = __mutex;
      pmVar10 = std::
                map<_cl_command_queue_*,_unsigned_int,_std::less<_cl_command_queue_*>,_std::allocator<std::pair<_cl_command_queue_*const,_unsigned_int>_>_>
                ::operator[](&this->m_QueueNumberMap,&local_c8);
      mVar2 = *pmVar10;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::append((char *)&local_a0);
      cacheDeviceInfo(this,local_b8);
      pmVar11 = std::
                map<_cl_device_id_*,_CLIntercept::SDeviceInfo,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_CLIntercept::SDeviceInfo>_>_>
                ::operator[](&this->m_DeviceInfoMap,&local_b8);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_a4 = mVar2;
      getDeviceIndexString(this,local_b8,&local_78);
      _Var5._M_p = local_78._M_dataplus._M_p;
      p_Var4 = local_c8;
      pcVar3 = (pmVar11->Name)._M_dataplus._M_p;
      CEnumNameMap::name_device_type_abi_cxx11_(&local_58,&this->m_EnumNameMap,pmVar11->Type);
      paVar1 = &local_58.field_2;
      snprintf(this->m_StringBuffer,0x4000," %p.%s %s (%s)",p_Var4,_Var5._M_p,pcVar3,
               local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,local_a0._M_dataplus._M_p,
                 local_a0._M_dataplus._M_p + local_a0._M_string_length);
      std::__cxx11::string::append((char *)&local_58);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      __mutex = local_b0;
      paVar1 = &local_78.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      local_58._M_dataplus._M_p = local_58._M_dataplus._M_p & 0xffffffff00000000;
      local_bc = 0;
      cVar7 = (*(this->m_Dispatch).clGetCommandQueueInfo)(local_c8,0x418c,4,&local_58,(size_t *)0x0)
      ;
      cVar8 = (*(this->m_Dispatch).clGetCommandQueueInfo)(local_c8,0x418d,4,&local_bc,(size_t *)0x0)
      ;
      mVar2 = local_a4;
      if (cVar8 == 0 && cVar7 == 0) {
        snprintf(this->m_StringBuffer,0x4000," (F:%u I:%u)",
                 (ulong)local_58._M_dataplus._M_p & 0xffffffff,(ulong)local_bc);
        local_78._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_a0._M_dataplus._M_p,
                   local_a0._M_dataplus._M_p + local_a0._M_string_length);
        std::__cxx11::string::append((char *)&local_78);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != paVar1) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      CChromeTracer::addQueueMetadata(&this->m_ChromeTrace,mVar2,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar12 = std::__throw_system_error(iVar6);
  if (local_78._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  pthread_mutex_unlock(local_b0);
  _Unwind_Resume(uVar12);
}

Assistant:

void CLIntercept::chromeRegisterCommandQueue(
    cl_command_queue queue )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_int  errorCode = CL_SUCCESS;

    cl_device_id                device = NULL;
    cl_device_type              deviceType = 0;
    cl_command_queue_properties properties = 0;

    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_DEVICE,
        sizeof(device),
        &device,
        NULL);
    errorCode |= dispatch().clGetDeviceInfo(
        device,
        CL_DEVICE_TYPE,
        sizeof(deviceType),
        &deviceType,
        NULL );
    errorCode |= dispatch().clGetCommandQueueInfo(
        queue,
        CL_QUEUE_PROPERTIES,
        sizeof(properties),
        &properties,
        NULL );

    if( errorCode == CL_SUCCESS )
    {
        unsigned int    queueNumber = m_QueueNumberMap[ queue ];

        std::string trackName;

        if( properties & CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE )
        {
            trackName += "OOQ";
        }
        else
        {
            trackName += "IOQ";
        }

        cacheDeviceInfo( device );

        const SDeviceInfo& deviceInfo = m_DeviceInfoMap[device];

        {
            std::string deviceIndexString;
            getDeviceIndexString(
                device,
                deviceIndexString );
            CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " %p.%s %s (%s)",
                queue,
                deviceIndexString.c_str(),
                deviceInfo.Name.c_str(),
                enumName().name_device_type( deviceInfo.Type ).c_str() );
            trackName = trackName + m_StringBuffer;
        }

        {
            cl_int  testError = CL_SUCCESS;

            cl_uint queueFamily = 0;
            cl_uint queueIndex = 0;

            testError |= dispatch().clGetCommandQueueInfo(
                queue,
                CL_QUEUE_FAMILY_INTEL,
                sizeof(queueFamily),
                &queueFamily,
                NULL );
            testError |= dispatch().clGetCommandQueueInfo(
                queue,
                CL_QUEUE_INDEX_INTEL,
                sizeof(queueIndex),
                &queueIndex,
                NULL );
            if( testError == CL_SUCCESS )
            {
                CLI_SPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, " (F:%u I:%u)",
                    queueFamily,
                    queueIndex );
                trackName = trackName + m_StringBuffer;
            }
        }

        m_ChromeTrace.addQueueMetadata( queueNumber, trackName );
    }
}